

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O0

void secp256k1_modinv32(secp256k1_modinv32_signed30 *x,secp256k1_modinv32_modinfo *modinfo)

{
  int iVar1;
  void *in_RSI;
  void *in_RDI;
  bool bVar2;
  secp256k1_modinv32_trans2x2 t;
  int32_t zeta;
  int i;
  secp256k1_modinv32_signed30 g;
  secp256k1_modinv32_signed30 f;
  secp256k1_modinv32_signed30 e;
  secp256k1_modinv32_signed30 d;
  int local_a4;
  undefined1 local_a0 [16];
  secp256k1_modinv32_modinfo *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff7c;
  uint32_t in_stack_ffffffffffffff80;
  int32_t in_stack_ffffffffffffff84;
  secp256k1_modinv32_signed30 *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  secp256k1_modinv32_signed30 *in_stack_ffffffffffffff98;
  undefined4 local_58 [9];
  undefined1 local_34 [36];
  void *local_10;
  void *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_34,0,0x24);
  memset(local_58,0,0x24);
  local_58[0] = 1;
  memcpy(&stack0xffffffffffffff84,local_10,0x24);
  memcpy(local_a0,local_8,0x24);
  local_a4 = 0;
  while( true ) {
    if (0x13 < local_a4) {
      iVar1 = secp256k1_modinv32_mul_cmp_30
                        (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                         in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
      if (iVar1 != 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
                ,0x237,
                "test condition failed: secp256k1_modinv32_mul_cmp_30(&g, 9, &SECP256K1_SIGNED30_ONE, 0) == 0"
               );
        abort();
      }
      iVar1 = secp256k1_modinv32_mul_cmp_30
                        (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                         in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
      bVar2 = true;
      if (iVar1 != 0) {
        iVar1 = secp256k1_modinv32_mul_cmp_30
                          (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                           in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
        bVar2 = true;
        if (iVar1 != 0) {
          iVar1 = secp256k1_modinv32_mul_cmp_30
                            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                             in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
          bVar2 = false;
          if (iVar1 == 0) {
            iVar1 = secp256k1_modinv32_mul_cmp_30
                              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                               in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
            bVar2 = false;
            if (iVar1 == 0) {
              iVar1 = secp256k1_modinv32_mul_cmp_30
                                (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                                 in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
              bVar2 = true;
              if (iVar1 != 0) {
                iVar1 = secp256k1_modinv32_mul_cmp_30
                                  (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                                   in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
                bVar2 = iVar1 == 0;
              }
            }
          }
        }
      }
      if (bVar2) {
        secp256k1_modinv32_normalize_30
                  ((secp256k1_modinv32_signed30 *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70);
        memcpy(local_8,local_34,0x24);
        return;
      }
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
              ,0x23e,
              "test condition failed: secp256k1_modinv32_mul_cmp_30(&f, 9, &SECP256K1_SIGNED30_ONE, -1) == 0 || secp256k1_modinv32_mul_cmp_30(&f, 9, &SECP256K1_SIGNED30_ONE, 1) == 0 || (secp256k1_modinv32_mul_cmp_30(x, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 && secp256k1_modinv32_mul_cmp_30(&d, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 && (secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) == 0 || secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, -1) == 0))"
             );
      abort();
    }
    secp256k1_modinv32_divsteps_30
              (in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
               (secp256k1_modinv32_trans2x2 *)in_stack_ffffffffffffff70);
    secp256k1_modinv32_update_de_30
              ((secp256k1_modinv32_signed30 *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88,
               (secp256k1_modinv32_trans2x2 *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (secp256k1_modinv32_modinfo *)
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    iVar1 = secp256k1_modinv32_mul_cmp_30
                      (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff88
                       ,in_stack_ffffffffffffff84);
    if (iVar1 < 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
              ,0x225,
              "test condition failed: secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, -1) > 0"
             );
      abort();
    }
    iVar1 = secp256k1_modinv32_mul_cmp_30
                      (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff88
                       ,in_stack_ffffffffffffff84);
    if (0 < iVar1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
              ,0x226,
              "test condition failed: secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) <= 0"
             );
      abort();
    }
    iVar1 = secp256k1_modinv32_mul_cmp_30
                      (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff88
                       ,in_stack_ffffffffffffff84);
    if (iVar1 < 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
              ,0x227,
              "test condition failed: secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, -1) > 0"
             );
      abort();
    }
    iVar1 = secp256k1_modinv32_mul_cmp_30
                      (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff88
                       ,in_stack_ffffffffffffff84);
    if (-1 < iVar1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
              ,0x228,
              "test condition failed: secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, 1) < 0"
             );
      abort();
    }
    secp256k1_modinv32_update_fg_30
              ((secp256k1_modinv32_signed30 *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (secp256k1_modinv32_signed30 *)
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               (secp256k1_modinv32_trans2x2 *)in_stack_ffffffffffffff70);
    iVar1 = secp256k1_modinv32_mul_cmp_30
                      (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff88
                       ,in_stack_ffffffffffffff84);
    if (iVar1 < 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
              ,0x22c,
              "test condition failed: secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, -1) > 0"
             );
      abort();
    }
    iVar1 = secp256k1_modinv32_mul_cmp_30
                      (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff88
                       ,in_stack_ffffffffffffff84);
    if (0 < iVar1) break;
    iVar1 = secp256k1_modinv32_mul_cmp_30
                      (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff88
                       ,in_stack_ffffffffffffff84);
    if (iVar1 < 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
              ,0x22e,
              "test condition failed: secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, -1) > 0"
             );
      abort();
    }
    iVar1 = secp256k1_modinv32_mul_cmp_30
                      (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff88
                       ,in_stack_ffffffffffffff84);
    if (-1 < iVar1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
              ,0x22f,
              "test condition failed: secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, 1) < 0"
             );
      abort();
    }
    local_a4 = local_a4 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
          ,0x22d,
          "test condition failed: secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) <= 0");
  abort();
}

Assistant:

static void secp256k1_modinv32(secp256k1_modinv32_signed30 *x, const secp256k1_modinv32_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, zeta=-1. */
    secp256k1_modinv32_signed30 d = {{0}};
    secp256k1_modinv32_signed30 e = {{1}};
    secp256k1_modinv32_signed30 f = modinfo->modulus;
    secp256k1_modinv32_signed30 g = *x;
    int i;
    int32_t zeta = -1; /* zeta = -(delta+1/2); delta is initially 1/2. */

    /* Do 20 iterations of 30 divsteps each = 600 divsteps. 590 suffices for 256-bit inputs. */
    for (i = 0; i < 20; ++i) {
        /* Compute transition matrix and new zeta after 30 divsteps. */
        secp256k1_modinv32_trans2x2 t;
        zeta = secp256k1_modinv32_divsteps_30(zeta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv32_update_de_30(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, 1) < 0);  /* g <  modulus */

        secp256k1_modinv32_update_fg_30(&f, &g, &t);

        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, 1) < 0);  /* g <  modulus */
    }

    /* At this point sufficient iterations have been performed that g must have reached 0
     * and (if g was not originally 0) f must now equal +/- GCD of the initial f, g
     * values i.e. +/- 1, and d now contains +/- the modular inverse. */

    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &SECP256K1_SIGNED30_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and |f|=modulus) */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &SECP256K1_SIGNED30_ONE, -1) == 0 ||
                 secp256k1_modinv32_mul_cmp_30(&f, 9, &SECP256K1_SIGNED30_ONE, 1) == 0 ||
                 (secp256k1_modinv32_mul_cmp_30(x, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  secp256k1_modinv32_mul_cmp_30(&d, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  (secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) == 0 ||
                   secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, -1) == 0)));

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv32_normalize_30(&d, f.v[8], modinfo);
    *x = d;
}